

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_2,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPUSSEImpl<double,_2,_0> *this,double *destP,double *partials_q,double *matrices_q,
          double *partials_r,double *matrices_r,int *activateScaling)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  double __x;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iStack_74;
  double *pdStack_70;
  double *pdStack_68;
  ulong uStack_60;
  double *pdStack_58;
  double *pdStack_50;
  double *pdStack_48;
  ulong uStack_40;
  ulong uStack_38;
  
  pdStack_70 = partials_q;
  pdStack_68 = partials_r;
  pdStack_58 = destP;
  pdStack_50 = matrices_q;
  pdStack_48 = matrices_r;
  for (uStack_60 = 0; (int)uStack_60 < (this->super_BeagleCPUImpl<double,_2,_0>).kCategoryCount;
      uStack_60 = (ulong)((int)uStack_60 + 1)) {
    iVar10 = (this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount;
    uVar8 = (ulong)(uint)((this->super_BeagleCPUImpl<double,_2,_0>).kPartialsPaddedStateCount *
                          (int)uStack_60 * iVar10);
    uStack_38 = uVar8;
    for (iVar7 = 0; pdVar5 = pdStack_68, pdVar4 = pdStack_70, iVar7 < iVar10; iVar7 = iVar7 + 1) {
      iVar9 = (int)uVar8;
      uStack_38 = (ulong)(int)uStack_38;
      iVar10 = 0;
      uVar11 = (this->super_BeagleCPUImpl<double,_2,_0>).kMatrixSize * (int)uStack_60;
      while( true ) {
        uStack_40 = (ulong)uVar11;
        uVar3 = (this->super_BeagleCPUImpl<double,_2,_0>).kStateCount;
        if ((int)uVar3 <= iVar10) break;
        auVar12 = ZEXT816(0) << 0x40;
        auVar13 = ZEXT816(0) << 0x40;
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          auVar14._8_8_ = 0;
          auVar14._0_8_ = matrices_q[(long)(int)uVar11 + uVar8];
          auVar15._8_8_ = 0;
          auVar15._0_8_ = matrices_r[(long)(int)uVar11 + uVar8];
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar4[(long)iVar9 + uVar8];
          auVar12 = vfmadd231sd_fma(auVar12,auVar14,auVar1);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pdVar5[(long)iVar9 + uVar8];
          auVar13 = vfmadd231sd_fma(auVar13,auVar15,auVar2);
        }
        __x = auVar12._0_8_ * auVar13._0_8_;
        destP[uStack_38] = __x;
        if (*activateScaling == 0) {
          frexp(__x,&iStack_74);
          iVar6 = -iStack_74;
          if (0 < iStack_74) {
            iVar6 = iStack_74;
          }
          if ((this->super_BeagleCPUImpl<double,_2,_0>).scalingExponentThreshold < iVar6) {
            *activateScaling = 1;
          }
          uVar11 = (uint)uStack_40;
          destP = pdStack_58;
          matrices_q = pdStack_50;
          matrices_r = pdStack_48;
        }
        uVar11 = uVar11 + 2 + uVar3;
        uStack_38 = uStack_38 + 1;
        iVar10 = iVar10 + 1;
      }
      iVar10 = (this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount;
      uVar8 = (ulong)(uint)(iVar9 + (this->super_BeagleCPUImpl<double,_2,_0>).
                                    kPartialsPaddedStateCount);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
void BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcPartialsPartialsAutoScaling(double* destP,
                                                         const double*  partials_q,
                                                         const double*  matrices_q,
                                                         const double*  partials_r,
                                                         const double*  matrices_r,
                                                                  int* activateScaling) {
    BeagleCPUImpl<BEAGLE_CPU_SSE_DOUBLE>::calcPartialsPartialsAutoScaling(destP,
                                                     partials_q,
                                                     matrices_q,
                                                     partials_r,
                                                     matrices_r,
                                                     activateScaling);
}